

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean process_restart(j_decompress_ptr cinfo)

{
  uint *puVar1;
  int iVar2;
  jpeg_marker_reader *pjVar3;
  jpeg_entropy_decoder *pjVar4;
  boolean bVar5;
  long lVar6;
  int iVar7;
  
  pjVar3 = cinfo->marker;
  pjVar4 = cinfo->entropy;
  iVar2 = *(int *)&pjVar4[1].decode_mcu;
  iVar7 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar7 = iVar2;
  }
  puVar1 = &pjVar3->discarded_bytes;
  *puVar1 = *puVar1 + (iVar7 >> 3);
  *(undefined4 *)&pjVar4[1].decode_mcu = 0;
  bVar5 = (*pjVar3->read_restart_marker)(cinfo);
  if (bVar5 == 0) {
    bVar5 = 0;
  }
  else {
    if (0 < cinfo->comps_in_scan) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&pjVar4[2].start_pass + lVar6 * 4 + 4) = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 < cinfo->comps_in_scan);
    }
    *(undefined4 *)&pjVar4[2].start_pass = 0;
    *(uint *)&pjVar4[3].decode_mcu = cinfo->restart_interval;
    bVar5 = 1;
    if (cinfo->unread_marker == 0) {
      *(undefined4 *)((long)&pjVar4[3].start_pass + 4) = 0;
    }
  }
  return bVar5;
}

Assistant:

LOCAL(void)
process_restart (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci;
  jpeg_component_info * compptr;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Re-initialize statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      MEMZERO(entropy->dc_stats[compptr->dc_tbl_no], DC_STAT_BINS);
      /* Reset DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      MEMZERO(entropy->ac_stats[compptr->ac_tbl_no], AC_STAT_BINS);
    }
  }

  /* Reset arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}